

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O1

Vec_Int_t * Gia_PolynAddHaRoots(Gia_Man_t *pGia)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p;
  int *piVar3;
  Vec_Int_t *vXorPairs;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar3 = (int *)malloc(400);
  p->pArray = piVar3;
  vXorPairs = (Vec_Int_t *)malloc(0x10);
  vXorPairs->nCap = 100;
  vXorPairs->nSize = 0;
  piVar3 = (int *)malloc(400);
  vXorPairs->pArray = piVar3;
  lVar4 = (long)pGia->vCos->nSize;
  if (lVar4 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar1 = pGia->vCos->pArray[lVar4 + -1];
  if ((-1 < (long)iVar1) && (iVar1 < pGia->nObjs)) {
    Gia_PolynCoreNonXors_rec
              (pGia,pGia->pObjs + iVar1 +
                    -(ulong)((uint)*(undefined8 *)(pGia->pObjs + iVar1) & 0x1fffffff),vXorPairs);
    Gia_ManSetPhase(pGia);
    if (1 < vXorPairs->nSize) {
      lVar4 = 1;
      do {
        iVar1 = vXorPairs->pArray[lVar4 + -1];
        if (((long)iVar1 < 0) || (pGia->nObjs <= iVar1)) goto LAB_0065c4cc;
        uVar2 = vXorPairs->pArray[lVar4];
        if (((int)uVar2 < 0) || (pGia->nObjs <= (int)uVar2)) goto LAB_0065c4cc;
        uVar2 = Gia_ManAppendAnd(pGia,iVar1 * 2 -
                                      (int)((long)*(undefined8 *)(pGia->pObjs + iVar1) >> 0x3f),
                                 uVar2 * 2 -
                                 (int)((long)*(undefined8 *)(pGia->pObjs + uVar2) >> 0x3f));
        if ((int)uVar2 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        Vec_IntPush(p,uVar2 >> 1);
        lVar4 = lVar4 + 2;
      } while ((int)lVar4 < vXorPairs->nSize);
    }
    if (vXorPairs->pArray != (int *)0x0) {
      free(vXorPairs->pArray);
      vXorPairs->pArray = (int *)0x0;
    }
    free(vXorPairs);
    uVar2 = p->nSize;
    if (1 < (int)uVar2) {
      piVar3 = p->pArray;
      uVar5 = uVar2 >> 1;
      uVar6 = 0;
      do {
        uVar2 = uVar2 - 1;
        iVar1 = piVar3[uVar6];
        piVar3[uVar6] = piVar3[(int)uVar2];
        piVar3[(int)uVar2] = iVar1;
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    return p;
  }
LAB_0065c4cc:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

Vec_Int_t * Gia_PolynAddHaRoots( Gia_Man_t * pGia )
{
    int i, iFan0, iFan1;
    Vec_Int_t * vNewOuts = Vec_IntAlloc( 100 );
    Vec_Int_t * vXorPairs = Vec_IntAlloc( 100 );
    Gia_Obj_t * pObj = Gia_ManCo( pGia, Gia_ManCoNum(pGia)-1 );
    Gia_PolynCoreNonXors_rec( pGia, Gia_ObjFanin0(pObj), vXorPairs );
    // add new outputs
    Gia_ManSetPhase( pGia );
    Vec_IntForEachEntryDouble( vXorPairs, iFan0, iFan1, i )
    {
        Gia_Obj_t * pFan0 = Gia_ManObj( pGia, iFan0 );
        Gia_Obj_t * pFan1 = Gia_ManObj( pGia, iFan1 );
        int iLit0 = Abc_Var2Lit( iFan0, pFan0->fPhase );
        int iLit1 = Abc_Var2Lit( iFan1, pFan1->fPhase );
        int iRoot = Gia_ManAppendAnd( pGia, iLit0, iLit1 );
        Vec_IntPush( vNewOuts, Abc_Lit2Var(iRoot) );
    }
    Vec_IntFree( vXorPairs );
    Vec_IntReverseOrder( vNewOuts );
//    Vec_IntPop( vNewOuts );
    return vNewOuts;
}